

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O2

BitMatrix * __thiscall
ZXing::OneD::Code93Writer::encode
          (BitMatrix *__return_storage_ptr__,Code93Writer *this,wstring *contents_,int width,
          int height)

{
  wchar_t wVar1;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  invalid_argument *piVar5;
  size_t i;
  size_type sVar6;
  size_type sVar7;
  char cVar8;
  int iVar9;
  size_type __n;
  reference rVar10;
  allocator<char> local_d1;
  int local_d0;
  int local_cc;
  string contents;
  vector<bool,_std::allocator<bool>_> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = contents_->_M_string_length;
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  contents._M_string_length = 0;
  contents.field_2._M_local_buf[0] = '\0';
  local_d0 = width;
  local_cc = height;
  std::__cxx11::string::reserve((ulong)&contents);
  sVar6 = 0;
  do {
    sVar3 = contents._M_string_length;
    if (sVar2 == sVar6) {
      if (contents._M_string_length == 0) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar5,"Found empty contents");
      }
      else {
        if (contents._M_string_length < 0x51) {
          local_50._M_dataplus._M_p._0_1_ = 0;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&result,contents._M_string_length * 9 + 0x25,(bool *)&local_50,
                     (allocator_type *)&local_70);
          AppendPattern(&result,0,0x15e);
          __n = 0x24;
          for (sVar7 = 0; iVar9 = (int)__n, sVar3 != sVar7; sVar7 = sVar7 + 1) {
            iVar4 = IndexOf("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*",
                            contents._M_dataplus._M_p[sVar7]);
            AppendPattern(&result,iVar9 + -0x1b,*(int *)(CHARACTER_ENCODINGS + (long)iVar4 * 4));
            __n = __n + 9;
          }
          iVar4 = ComputeChecksumIndex(&contents,0x14);
          AppendPattern(&result,iVar9 + -0x1b,*(int *)(CHARACTER_ENCODINGS + (long)iVar4 * 4));
          std::__cxx11::string::push_back((char)&contents);
          iVar4 = ComputeChecksumIndex(&contents,0xf);
          AppendPattern(&result,iVar9 + -0x12,*(int *)(CHARACTER_ENCODINGS + (long)iVar4 * 4));
          AppendPattern(&result,iVar9 + -9,0x15e);
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&result,__n);
          *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
          iVar9 = 10;
          if (-1 < this->_sidesMargin) {
            iVar9 = this->_sidesMargin;
          }
          WriterHelper::RenderResult(__return_storage_ptr__,&result,local_d0,local_cc,iVar9);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&result.super__Bvector_base<std::allocator<bool>_>);
          std::__cxx11::string::~string((string *)&contents);
          return __return_storage_ptr__;
        }
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar5,
                   "Requested contents should be less than 80 digits long after converting to extended encoding"
                  );
      }
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    wVar1 = (contents_->_M_dataplus)._M_p[sVar6];
    if (wVar1 == L'\0') goto LAB_001799ff;
    cVar8 = (char)&contents;
    if (wVar1 < L'\x1b') {
      std::__cxx11::string::push_back(cVar8);
LAB_001799e5:
      std::__cxx11::string::push_back(cVar8);
    }
    else {
      if ((uint)wVar1 < 0x20) {
        std::__cxx11::string::push_back(cVar8);
        goto LAB_001799e5;
      }
      if ((((wVar1 & 0x7ffffffbU) == 0x20) || (wVar1 == L'+')) || (wVar1 == L'%'))
      goto LAB_001799e5;
      if ((uint)wVar1 < 0x2d) {
        std::__cxx11::string::push_back(cVar8);
        goto LAB_001799e5;
      }
      if ((uint)wVar1 < 0x3a) goto LAB_001799e5;
      if (wVar1 != L':') {
        if ((uint)wVar1 < 0x40) {
          std::__cxx11::string::push_back(cVar8);
        }
        else {
          if (wVar1 == L'@') goto LAB_001799ff;
          if (0x5a < (uint)wVar1) {
            if ((uint)wVar1 < 0x60) {
              std::__cxx11::string::push_back(cVar8);
            }
            else {
              if (wVar1 == L'`') goto LAB_001799ff;
              if ((uint)wVar1 < 0x7b) {
                std::__cxx11::string::push_back(cVar8);
              }
              else {
                if (0x7f < (uint)wVar1) {
                  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10,"bW");
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_70,
                             "Requested content contains a non-encodable character: \'",&local_d1);
                  std::operator+(&local_50,&local_70,(char)wVar1);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&result,&local_50,"\'");
                  std::invalid_argument::invalid_argument(piVar5,(string *)&result);
                  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                std::__cxx11::string::push_back(cVar8);
              }
            }
          }
        }
        goto LAB_001799e5;
      }
LAB_001799ff:
      std::__cxx11::string::append((char *)&contents);
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

BitMatrix
Code93Writer::encode(const std::wstring& contents_, int width, int height) const
{
	std::string contents = Code93ConvertToExtended(contents_);

	size_t length = contents.length();
	if (length == 0) {
		throw std::invalid_argument("Found empty contents");
	}
	if (length > 80) {
		throw std::invalid_argument("Requested contents should be less than 80 digits long after converting to extended encoding");
	}

	//length of code + 2 start/stop characters + 2 checksums, each of 9 bits, plus a termination bar
	size_t codeWidth = (contents.length() + 2 + 2) * 9 + 1;

	std::vector<bool> result(codeWidth, false);

	//start character (*)
	int pos = AppendPattern(result, 0, ASTERISK_ENCODING);

	for (size_t i = 0; i < length; i++) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[indexInString]);
	}

	//add two checksums
	int check1 = ComputeChecksumIndex(contents, 20);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check1]);

	//append the contents to reflect the first checksum added
	contents += static_cast<wchar_t>(ALPHABET[check1]);

	int check2 = ComputeChecksumIndex(contents, 15);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check2]);

	//end character (*)
	pos += AppendPattern(result, pos, ASTERISK_ENCODING);

	//termination bar (single black bar)
	result[pos] = true;

	return WriterHelper::RenderResult(result, width, height, _sidesMargin >= 0 ? _sidesMargin : 10);
}